

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O1

vector<duckdb::IndexBufferInfo,_true> * __thiscall
duckdb::FixedSizeAllocator::InitSerializationToWAL
          (vector<duckdb::IndexBufferInfo,_true> *__return_storage_ptr__,FixedSizeAllocator *this)

{
  _Hash_node_base *this_00;
  pointer pFVar1;
  _Hash_node_base *p_Var2;
  data_ptr_t local_30;
  
  (__return_storage_ptr__->
  super_vector<duckdb::IndexBufferInfo,_std::allocator<duckdb::IndexBufferInfo>_>).
  super__Vector_base<duckdb::IndexBufferInfo,_std::allocator<duckdb::IndexBufferInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::IndexBufferInfo,_std::allocator<duckdb::IndexBufferInfo>_>).
  super__Vector_base<duckdb::IndexBufferInfo,_std::allocator<duckdb::IndexBufferInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::IndexBufferInfo,_std::allocator<duckdb::IndexBufferInfo>_>).
  super__Vector_base<duckdb::IndexBufferInfo,_std::allocator<duckdb::IndexBufferInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = (this->buffers)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      this_00 = p_Var2 + 2;
      pFVar1 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)this_00);
      FixedSizeBuffer::SetAllocationSize
                (pFVar1,this->available_segments_per_buffer,this->segment_size,this->bitmask_offset)
      ;
      pFVar1 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)this_00);
      local_30 = FixedSizeBuffer::Get(pFVar1,true);
      pFVar1 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)this_00);
      ::std::vector<duckdb::IndexBufferInfo,std::allocator<duckdb::IndexBufferInfo>>::
      emplace_back<unsigned_char*,unsigned_long&>
                ((vector<duckdb::IndexBufferInfo,std::allocator<duckdb::IndexBufferInfo>> *)
                 __return_storage_ptr__,&local_30,&pFVar1->allocation_size);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<IndexBufferInfo> FixedSizeAllocator::InitSerializationToWAL() {
	vector<IndexBufferInfo> buffer_infos;
	for (auto &buffer : buffers) {
		buffer.second->SetAllocationSize(available_segments_per_buffer, segment_size, bitmask_offset);
		buffer_infos.emplace_back(buffer.second->Get(), buffer.second->allocation_size);
	}
	return buffer_infos;
}